

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void storeRGBX32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  long lVar2;
  float fVar3;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar4 [16];
  float fVar8;
  float fVar10;
  float fVar11;
  undefined1 auVar9 [16];
  float fVar12;
  
  auVar1 = _DAT_0068fad0;
  if (0 < count) {
    lVar2 = 0;
    do {
      auVar9 = *(undefined1 (*) [16])((long)&src->r + lVar2);
      fVar3 = auVar9._0_4_;
      fVar5 = auVar9._4_4_;
      fVar6 = auVar9._8_4_;
      fVar7 = auVar9._12_4_;
      if (((fVar7 != 1.0) || (NAN(fVar7))) && ((fVar7 != 0.0 || (auVar9 = auVar1, NAN(fVar7))))) {
        auVar9._4_4_ = fVar7;
        auVar9._0_4_ = fVar7;
        auVar9._8_4_ = fVar7;
        auVar9._12_4_ = fVar7;
        auVar9 = rcpps(auVar1,auVar9);
        fVar8 = auVar9._0_4_;
        fVar10 = auVar9._4_4_;
        fVar11 = auVar9._8_4_;
        fVar12 = auVar9._12_4_;
        auVar4._0_4_ = fVar3 * ((fVar8 + fVar8) - fVar7 * fVar8 * fVar8);
        auVar4._4_4_ = fVar5 * ((fVar10 + fVar10) - fVar7 * fVar10 * fVar10);
        auVar4._8_4_ = fVar6 * ((fVar11 + fVar11) - fVar7 * fVar11 * fVar11);
        auVar4._12_4_ = fVar7 * ((fVar12 + fVar12) - fVar7 * fVar12 * fVar12);
        auVar9 = insertps(auVar4,0x3f800000,0x30);
      }
      *(undefined1 (*) [16])(dest + lVar2 + (long)index * 0x10) = auVar9;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar2);
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBX32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set_ps(1.0f, 0.0f, 0.0f, 0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsf = _mm_mul_ps(vsf, vsr);
            vsf = _mm_insert_ps(vsf, _mm_set_ss(1.0f), 0x30);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}